

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::StopDebuggerIfNeeded(cmake *this,int exitCode)

{
  cmDebuggerAdapter *this_00;
  
  if ((this->DebuggerOn == true) &&
     (this_00 = (this->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     , this_00 != (cmDebuggerAdapter *)0x0)) {
    cmDebugger::cmDebuggerAdapter::ReportExitCode(this_00,exitCode);
    std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
    return;
  }
  return;
}

Assistant:

void cmake::StopDebuggerIfNeeded(int exitCode)
{
  if (!this->GetDebuggerOn()) {
    return;
  }

  // The debug adapter may have failed to start (e.g. invalid pipe path).
  if (DebugAdapter != nullptr) {
    DebugAdapter->ReportExitCode(exitCode);
    DebugAdapter.reset();
  }
}